

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_GLSL_attribute(Context *ctx,RegisterType regtype,int regnum,MOJOSHADER_usage usage,
                        int index,int wmask,int flags)

{
  int iVar1;
  char *pcVar2;
  undefined4 in_register_00000084;
  char *pcVar3;
  char *pcVar4;
  char index_str [16];
  char var [64];
  
  index_str[0] = '\0';
  index_str[1] = '\0';
  index_str[2] = '\0';
  index_str[3] = '\0';
  index_str[4] = '\0';
  index_str[5] = '\0';
  index_str[6] = '\0';
  index_str[7] = '\0';
  index_str[8] = '\0';
  index_str[9] = '\0';
  index_str[10] = '\0';
  index_str[0xb] = '\0';
  index_str[0xc] = '\0';
  index_str[0xd] = '\0';
  index_str[0xe] = '\0';
  index_str[0xf] = '\0';
  get_GLSL_varname_in_buf(ctx,regtype,regnum,var,CONCAT44(in_register_00000084,index));
  if (index != 0) {
    snprintf(index_str,0x10,"%u",(ulong)(uint)index);
  }
  if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
    if ((flags & 4U) != 0) {
      failf(ctx,"centroid unsupported in %s profile",ctx->profile->name);
      return;
    }
    pcVar2 = "";
    if (regtype == REG_TYPE_DEPTHOUT) {
      pcVar3 = "gl_FragDepth";
LAB_0010feb8:
      pcVar4 = "";
    }
    else {
      if (regtype != REG_TYPE_COLOROUT) {
        if ((regtype & ~REG_TYPE_CONST) == REG_TYPE_INPUT) {
          if (usage == MOJOSHADER_USAGE_COLOR) {
            index_str._0_8_ = (ulong)(uint7)index_str._1_7_ << 8;
            if (index == 1) {
              iVar1 = ctx->profile_supports_glsles;
              pcVar4 = "gl_SecondaryColor";
              pcVar3 = "v_FrontSecondaryColor";
            }
            else {
              if (index != 0) goto LAB_0010feb5;
              iVar1 = ctx->profile_supports_glsles;
              pcVar4 = "gl_Color";
              pcVar3 = "v_FrontColor";
            }
            if (iVar1 == 0) {
              pcVar3 = pcVar4;
            }
            goto LAB_0010feb8;
          }
          if ((usage == MOJOSHADER_USAGE_TEXCOORD) &&
             (iVar1 = shader_version_atleast(ctx,'\x01','\x04'), iVar1 != 0)) {
            snprintf(index_str,0x10,"%u",(ulong)(uint)index);
            pcVar3 = "v_TexCoord";
            if (ctx->profile_supports_glsles == 0) {
              pcVar3 = "gl_TexCoord";
            }
            pcVar4 = "]";
            pcVar2 = "[";
            goto LAB_0010febb;
          }
        }
        else {
          if (regtype == REG_TYPE_MISCTYPE) {
            if (regnum == 0) {
              index_str._0_8_ = (ulong)(uint7)index_str._1_7_ << 8;
              pcVar3 = "gl_FragCoord";
            }
            else {
              if (regnum != 1) {
                pcVar3 = "BUG: unhandled misc register";
                goto LAB_0010fead;
              }
              push_output(ctx,&ctx->globals);
              output_line(ctx,"float %s = gl_FrontFacing ? 1.0 : -1.0;",var);
              pop_output(ctx);
              pcVar3 = (char *)0x0;
            }
            goto LAB_0010feb8;
          }
          pcVar3 = "unknown pixel shader attribute register";
LAB_0010fead:
          fail(ctx,pcVar3);
        }
LAB_0010feb5:
        pcVar3 = (char *)0x0;
        goto LAB_0010feb8;
      }
      if (ctx->have_multi_color_outputs == 0) {
        pcVar3 = "gl_FragColor";
        goto LAB_0010feb8;
      }
      snprintf(index_str,0x10,"%u",(ulong)(uint)regnum);
      pcVar4 = "]";
      pcVar2 = "[";
      pcVar3 = "gl_FragData";
    }
LAB_0010febb:
    push_output(ctx,&ctx->globals);
  }
  else {
    if (ctx->shader_type != MOJOSHADER_TYPE_VERTEX) {
      pcVar2 = "Unknown shader type";
      goto LAB_0010fba9;
    }
    iVar1 = shader_version_atleast(ctx,'\x03','\0');
    if (iVar1 != 0) {
      regnum = index;
      if (regtype == REG_TYPE_OUTPUT) {
LAB_0010fd4a:
        pcVar3 = (char *)0x0;
        switch(usage) {
        case MOJOSHADER_USAGE_POSITION:
          pcVar3 = "gl_Position";
          break;
        case MOJOSHADER_USAGE_POINTSIZE:
          pcVar3 = "gl_PointSize";
          break;
        case MOJOSHADER_USAGE_TEXCOORD:
          goto LAB_0010fdbe;
        case MOJOSHADER_USAGE_COLOR:
          goto switchD_0010fd6f_caseD_a;
        case MOJOSHADER_USAGE_FOG:
          pcVar3 = "gl_FogFragCoord";
        }
        goto switchD_0010fd6f_caseD_1;
      }
      if (regtype != REG_TYPE_INPUT) goto switchD_0010fbf1_caseD_2;
switchD_0010fbf1_caseD_1:
      push_output(ctx,&ctx->globals);
      output_line(ctx,"attribute vec4 %s;",var);
      goto LAB_0010ff37;
    }
    switch(regtype) {
    case REG_TYPE_INPUT:
      goto switchD_0010fbf1_caseD_1;
    default:
switchD_0010fbf1_caseD_2:
      pcVar2 = "unknown vertex shader attribute register";
LAB_0010fba9:
      fail(ctx,pcVar2);
      return;
    case REG_TYPE_RASTOUT:
      if (2 < (uint)regnum) goto LAB_0010fd4a;
      usage = *(MOJOSHADER_usage *)(&DAT_00126550 + (ulong)(uint)regnum * 4);
      pcVar3 = &DAT_00126538 + *(int *)(&DAT_00126538 + (ulong)(uint)regnum * 4);
      break;
    case REG_TYPE_ATTROUT:
switchD_0010fd6f_caseD_a:
      index_str._0_8_ = index_str._0_8_ & 0xffffffffffffff00;
      usage = MOJOSHADER_USAGE_COLOR;
      if (regnum == 1) {
        pcVar3 = "v_FrontSecondaryColor";
        if (ctx->profile_supports_glsles == 0) {
          pcVar3 = "gl_FrontSecondaryColor";
        }
        regnum = 1;
      }
      else if (regnum == 0) {
        pcVar3 = "v_FrontColor";
        if (ctx->profile_supports_glsles == 0) {
          pcVar3 = "gl_FrontColor";
        }
        regnum = 0;
      }
      else {
        pcVar3 = (char *)0x0;
      }
      break;
    case REG_TYPE_OUTPUT:
LAB_0010fdbe:
      snprintf(index_str,0x10,"%u",(ulong)(uint)regnum);
      pcVar3 = "v_TexCoord";
      if (ctx->profile_supports_glsles == 0) {
        pcVar3 = "gl_TexCoord";
      }
      pcVar4 = "]";
      pcVar2 = "[";
      usage = MOJOSHADER_USAGE_TEXCOORD;
      goto LAB_0010fe3a;
    }
switchD_0010fd6f_caseD_1:
    pcVar4 = "";
    pcVar2 = pcVar4;
LAB_0010fe3a:
    push_output(ctx,&ctx->globals);
    index = regnum;
  }
  if (pcVar3 == (char *)0x0) {
    pcVar2 = "varying highp vec4 io_%i_%i;";
    if (ctx->profile_supports_glsles == 0) {
      pcVar2 = "varying vec4 io_%i_%i;";
    }
    output_line(ctx,pcVar2,usage,(ulong)(uint)index);
    output_line(ctx,"#define %s io_%i_%i",var,usage,(ulong)(uint)index);
  }
  else {
    output_line(ctx,"#define %s %s%s%s%s",var,pcVar3,pcVar2,index_str,pcVar4);
  }
LAB_0010ff37:
  pop_output(ctx);
  return;
}

Assistant:

static void emit_GLSL_attribute(Context *ctx, RegisterType regtype, int regnum,
                                MOJOSHADER_usage usage, int index, int wmask,
                                int flags)
{
    // !!! FIXME: this function doesn't deal with write masks at all yet!
    const char *usage_str = NULL;
    const char *arrayleft = "";
    const char *arrayright = "";
    char index_str[16] = { '\0' };
    char var[64];

    get_GLSL_varname_in_buf(ctx, regtype, regnum, var, sizeof (var));

    //assert((flags & MOD_PP) == 0);  // !!! FIXME: is PP allowed?

    if (index != 0)  // !!! FIXME: a lot of these MUST be zero.
        snprintf(index_str, sizeof (index_str), "%u", (uint) index);

    if (shader_is_vertex(ctx))
    {
        // pre-vs3 output registers.
        // these don't ever happen in DCL opcodes, I think. Map to vs_3_*
        //  output registers.
        if (!shader_version_atleast(ctx, 3, 0))
        {
            if (regtype == REG_TYPE_RASTOUT)
            {
                regtype = REG_TYPE_OUTPUT;
                index = regnum;
                switch ((const RastOutType) regnum)
                {
                    case RASTOUT_TYPE_POSITION:
                        usage = MOJOSHADER_USAGE_POSITION;
                        break;
                    case RASTOUT_TYPE_FOG:
                        usage = MOJOSHADER_USAGE_FOG;
                        break;
                    case RASTOUT_TYPE_POINT_SIZE:
                        usage = MOJOSHADER_USAGE_POINTSIZE;
                        break;
                } // switch
            } // if

            else if (regtype == REG_TYPE_ATTROUT)
            {
                regtype = REG_TYPE_OUTPUT;
                usage = MOJOSHADER_USAGE_COLOR;
                index = regnum;
            } // else if

            else if (regtype == REG_TYPE_TEXCRDOUT)
            {
                regtype = REG_TYPE_OUTPUT;
                usage = MOJOSHADER_USAGE_TEXCOORD;
                index = regnum;
            } // else if
        } // if

        // to avoid limitations of various GL entry points for input
        // attributes (glSecondaryColorPointer() can only take 3 component
        // items, glVertexPointer() can't do GL_UNSIGNED_BYTE, many other
        // issues), we set up all inputs as generic vertex attributes, so we
        // can pass data in just about any form, and ignore the built-in GLSL
        // attributes like gl_SecondaryColor. Output needs to use the the
        // built-ins, though, but we don't have to worry about the GL entry
        // point limitations there.

        if (regtype == REG_TYPE_INPUT)
        {
            push_output(ctx, &ctx->globals);
            output_line(ctx, "attribute vec4 %s;", var);
            pop_output(ctx);
        } // if

        else if (regtype == REG_TYPE_OUTPUT)
        {
            switch (usage)
            {
                case MOJOSHADER_USAGE_POSITION:
                    usage_str = "gl_Position";
                    break;
                case MOJOSHADER_USAGE_POINTSIZE:
                    usage_str = "gl_PointSize";
                    break;
                case MOJOSHADER_USAGE_COLOR:
                    index_str[0] = '\0';  // no explicit number.
                    if (index == 0)
                    {
#if SUPPORT_PROFILE_GLSLES
                        if (support_glsles(ctx))
                            usage_str = "v_FrontColor";
                        else
#endif
                        usage_str = "gl_FrontColor";
                    } // if
                    else if (index == 1)
                    {
#if SUPPORT_PROFILE_GLSLES
                        if (support_glsles(ctx))
                            usage_str = "v_FrontSecondaryColor";
                        else
#endif
                        usage_str = "gl_FrontSecondaryColor";
                    } // else if
                    break;
                case MOJOSHADER_USAGE_FOG:
                    usage_str = "gl_FogFragCoord";
                    break;
                case MOJOSHADER_USAGE_TEXCOORD:
                    snprintf(index_str, sizeof (index_str), "%u", (uint) index);
#if SUPPORT_PROFILE_GLSLES
                    if (support_glsles(ctx))
                        usage_str = "v_TexCoord";
                    else
#endif
                    usage_str = "gl_TexCoord";
                    arrayleft = "[";
                    arrayright = "]";
                    break;
                default:
                    // !!! FIXME: we need to deal with some more built-in varyings here.
                    break;
            } // switch

            // !!! FIXME: the #define is a little hacky, but it means we don't
            // !!! FIXME:  have to track these separately if this works.
            push_output(ctx, &ctx->globals);
            // no mapping to built-in var? Just make it a regular global, pray.
            if (usage_str == NULL)
            {
#if SUPPORT_PROFILE_GLSLES
                if (support_glsles(ctx))
                    output_line(ctx, "varying highp vec4 io_%i_%i;", usage, index);
                else
#endif
                output_line(ctx, "varying vec4 io_%i_%i;", usage, index);
                output_line(ctx, "#define %s io_%i_%i", var, usage, index);
            } // if
            else
            {
                output_line(ctx, "#define %s %s%s%s%s", var, usage_str,
                            arrayleft, index_str, arrayright);
            } // else
            pop_output(ctx);
        } // else if

        else
        {
            fail(ctx, "unknown vertex shader attribute register");
        } // else
    } // if

    else if (shader_is_pixel(ctx))
    {
        // samplers DCLs get handled in emit_GLSL_sampler().

        if (flags & MOD_CENTROID)  // !!! FIXME
        {
            failf(ctx, "centroid unsupported in %s profile", ctx->profile->name);
            return;
        } // if

        if (regtype == REG_TYPE_COLOROUT)
        {
            if (!ctx->have_multi_color_outputs)
                usage_str = "gl_FragColor";  // maybe faster?
            else
            {
                snprintf(index_str, sizeof (index_str), "%u", (uint) regnum);
                usage_str = "gl_FragData";
                arrayleft = "[";
                arrayright = "]";
            } // else
        } // if

        else if (regtype == REG_TYPE_DEPTHOUT)
            usage_str = "gl_FragDepth";

        // !!! FIXME: can you actualy have a texture register with COLOR usage?
        else if ((regtype == REG_TYPE_TEXTURE) || (regtype == REG_TYPE_INPUT))
        {
            if (usage == MOJOSHADER_USAGE_TEXCOORD)
            {
                // ps_1_1 does a different hack for this attribute.
                //  Refer to emit_GLSL_global()'s REG_TYPE_ADDRESS code.
                if (shader_version_atleast(ctx, 1, 4))
                {
                    snprintf(index_str, sizeof (index_str), "%u", (uint) index);
#if SUPPORT_PROFILE_GLSLES
                    if (support_glsles(ctx))
                        usage_str = "v_TexCoord";
                    else
#endif
                    usage_str = "gl_TexCoord";
                    arrayleft = "[";
                    arrayright = "]";
                } // if
            } // if

            else if (usage == MOJOSHADER_USAGE_COLOR)
            {
                index_str[0] = '\0';  // no explicit number.
                if (index == 0)
                {
#if SUPPORT_PROFILE_GLSLES
                    if (support_glsles(ctx))
                        usage_str = "v_FrontColor";
                    else
#endif
                    usage_str = "gl_Color";
                } // if
                else if (index == 1)
                {
#if SUPPORT_PROFILE_GLSLES
                    if (support_glsles(ctx))
                        usage_str = "v_FrontSecondaryColor";
                    else
#endif
                    usage_str = "gl_SecondaryColor";
                } // else if
                // FIXME: Does this even matter when we have varyings? -flibit
                // else
                //    fail(ctx, "unsupported color index");
            } // else if
        } // else if

        else if (regtype == REG_TYPE_MISCTYPE)
        {
            const MiscTypeType mt = (MiscTypeType) regnum;
            if (mt == MISCTYPE_TYPE_FACE)
            {
                push_output(ctx, &ctx->globals);
                output_line(ctx, "float %s = gl_FrontFacing ? 1.0 : -1.0;", var);
                pop_output(ctx);
            } // if
            else if (mt == MISCTYPE_TYPE_POSITION)
            {
                index_str[0] = '\0';  // no explicit number.
                usage_str = "gl_FragCoord";  // !!! FIXME: is this the same coord space as D3D?
            } // else if
            else
            {
                fail(ctx, "BUG: unhandled misc register");
            } // else
        } // else if

        else
        {
            fail(ctx, "unknown pixel shader attribute register");
        } // else

        push_output(ctx, &ctx->globals);
        // no mapping to built-in var? Just make it a regular global, pray.
        if (usage_str == NULL)
        {
#if SUPPORT_PROFILE_GLSLES
            if (support_glsles(ctx))
                output_line(ctx, "varying highp vec4 io_%i_%i;", usage, index);
            else
#endif
            output_line(ctx, "varying vec4 io_%i_%i;", usage, index);
            output_line(ctx, "#define %s io_%i_%i", var, usage, index);
        } // if
        else
        {
            output_line(ctx, "#define %s %s%s%s%s", var, usage_str,
                        arrayleft, index_str, arrayright);
        } // else
        pop_output(ctx);
    } // else if

    else
    {
        fail(ctx, "Unknown shader type");  // state machine should catch this.
    } // else
}